

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void __thiscall google::protobuf::CEscapeAndAppend(protobuf *this,StringPiece src,string *dest)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  size_type sVar4;
  const_pointer pcVar5;
  char *pcVar6;
  ulong uStack_50;
  uchar c;
  size_type i;
  char *append_ptr;
  size_t cur_dest_len;
  size_t escaped_len;
  string *dest_local;
  StringPiece src_local;
  
  pcVar6 = (char *)src.length_;
  src_local.ptr_ = src.ptr_;
  dest_local = (string *)this;
  sVar3 = CEscapedLength(this,src);
  sVar4 = stringpiece_internal::StringPiece::size((StringPiece *)&dest_local);
  if (sVar3 == sVar4) {
    pcVar5 = stringpiece_internal::StringPiece::data((StringPiece *)&dest_local);
    stringpiece_internal::StringPiece::size((StringPiece *)&dest_local);
    std::__cxx11::string::append(pcVar6,(ulong)pcVar5);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)pcVar6);
    i = std::__cxx11::string::operator[]((ulong)pcVar6);
    for (uStack_50 = 0; sVar4 = stringpiece_internal::StringPiece::size((StringPiece *)&dest_local),
        uStack_50 < sVar4; uStack_50 = uStack_50 + 1) {
      bVar1 = stringpiece_internal::StringPiece::operator[]((StringPiece *)&dest_local,uStack_50);
      if (bVar1 == 9) {
        *(undefined1 *)i = 0x5c;
        *(undefined1 *)(i + 1) = 0x74;
        i = i + 2;
      }
      else if (bVar1 == 10) {
        *(undefined1 *)i = 0x5c;
        *(undefined1 *)(i + 1) = 0x6e;
        i = i + 2;
      }
      else if (bVar1 == 0xd) {
        *(undefined1 *)i = 0x5c;
        *(undefined1 *)(i + 1) = 0x72;
        i = i + 2;
      }
      else if (bVar1 == 0x22) {
        *(undefined1 *)i = 0x5c;
        *(undefined1 *)(i + 1) = 0x22;
        i = i + 2;
      }
      else if (bVar1 == 0x27) {
        *(undefined1 *)i = 0x5c;
        *(undefined1 *)(i + 1) = 0x27;
        i = i + 2;
      }
      else if (bVar1 == 0x5c) {
        *(undefined1 *)i = 0x5c;
        *(undefined1 *)(i + 1) = 0x5c;
        i = i + 2;
      }
      else {
        uVar2 = isprint((int)(char)bVar1);
        if ((uVar2 & 1) == 0) {
          *(undefined1 *)i = 0x5c;
          *(byte *)(i + 1) = bVar1 / 0x40 + 0x30;
          *(char *)(i + 2) = (char)(((ulong)bVar1 % 0x40) / 8) + '0';
          *(byte *)(i + 3) = bVar1 % 8 + 0x30;
          i = i + 4;
        }
        else {
          *(byte *)i = bVar1;
          i = i + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void CEscapeAndAppend(StringPiece src, std::string *dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  size_t cur_dest_len = dest->size();
  dest->resize(cur_dest_len + escaped_len);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (StringPiece::size_type i = 0; i < src.size(); ++i) {
    unsigned char c = static_cast<unsigned char>(src[i]);
    switch (c) {
      case '\n': *append_ptr++ = '\\'; *append_ptr++ = 'n'; break;
      case '\r': *append_ptr++ = '\\'; *append_ptr++ = 'r'; break;
      case '\t': *append_ptr++ = '\\'; *append_ptr++ = 't'; break;
      case '\"': *append_ptr++ = '\\'; *append_ptr++ = '\"'; break;
      case '\'': *append_ptr++ = '\\'; *append_ptr++ = '\''; break;
      case '\\': *append_ptr++ = '\\'; *append_ptr++ = '\\'; break;
      default:
        if (!isprint(c)) {
          *append_ptr++ = '\\';
          *append_ptr++ = '0' + c / 64;
          *append_ptr++ = '0' + (c % 64) / 8;
          *append_ptr++ = '0' + c % 8;
        } else {
          *append_ptr++ = c;
        }
        break;
    }
  }
}